

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O2

int testArgumentParser(int param_1,char **param_2)

{
  bool bVar1;
  cmArgumentParser<void> *pcVar2;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unparsedArguments_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args_00;
  char *pcVar4;
  size_t pos;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  static_string_view name_15;
  static_string_view name_16;
  static_string_view name_17;
  static_string_view name_18;
  static_string_view name_19;
  static_string_view name_20;
  static_string_view name_21;
  static_string_view name_22;
  static_string_view name_23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  _Any_data local_578;
  code *local_568;
  code *local_560;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments_1;
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_4e8;
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_4c8;
  undefined1 local_4a8 [16];
  code *local_498;
  code *local_490;
  undefined1 local_488 [16];
  code *local_478;
  code *local_470;
  undefined1 local_468 [16];
  code *local_458;
  code *local_450;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  undefined1 local_428 [16];
  code *local_418;
  code *local_410;
  ParseResult local_408;
  Result result;
  
  unparsedArguments_00 = &unparsedArguments;
  anon_unknown.dwarf_12986::Result::Result(&result);
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578._8_8_ = 0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_560 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:256:13)>
              ::_M_invoke;
  local_568 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:256:13)>
              ::_M_manager;
  unparsedArguments_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unparsedArguments_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578._M_unused._M_object = &result;
  pcVar2 = cmArgumentParser<void>::Bind
                     ((cmArgumentParser<void> *)&unparsedArguments_1,0,&result.Pos0);
  pcVar2 = cmArgumentParser<void>::Bind(pcVar2,1,&result.Pos1);
  pcVar2 = cmArgumentParser<void>::Bind(pcVar2,2,&result.Pos2);
  name.super_string_view._M_str = "OPTION_1";
  name.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<bool>(pcVar2,name,&result.Option1);
  name_00.super_string_view._M_str = "OPTION_2";
  name_00.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<bool>(pcVar2,name_00,&result.Option2);
  name_01.super_string_view._M_str = "STRING_1";
  name_01.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<std::__cxx11::string>(pcVar2,name_01,&result.String1);
  name_02.super_string_view._M_str = "STRING_2";
  name_02.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar2,name_02,&result.String2);
  name_03.super_string_view._M_str = "STRING_3";
  name_03.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar2,name_03,&result.String3);
  name_04.super_string_view._M_str = "STRING_4";
  name_04.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<ArgumentParser::Maybe<std::__cxx11::string>>
                     (pcVar2,name_04,&result.String4);
  name_05.super_string_view._M_str = "STRING_5";
  name_05.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<ArgumentParser::NonEmpty<std::__cxx11::string>>
                     (pcVar2,name_05,&result.String5);
  name_06.super_string_view._M_str = "STRING_6";
  name_06.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<ArgumentParser::NonEmpty<std::__cxx11::string>>
                     (pcVar2,name_06,&result.String6);
  name_07.super_string_view._M_str = "LIST_1";
  name_07.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (pcVar2,name_07,&result.List1);
  name_08.super_string_view._M_str = "LIST_2";
  name_08.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (pcVar2,name_08,&result.List2);
  name_09.super_string_view._M_str = "LIST_3";
  name_09.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_09,&result.List3);
  name_10.super_string_view._M_str = "LIST_4";
  name_10.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_10,&result.List4);
  name_11.super_string_view._M_str = "LIST_5";
  name_11.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_11,&result.List5);
  name_12.super_string_view._M_str = "LIST_6";
  name_12.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_12,&result.List6);
  name_13.super_string_view._M_str = "MULTI_1";
  name_13.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_13,&result.Multi1);
  name_14.super_string_view._M_str = "MULTI_2";
  name_14.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_14,&result.Multi2);
  name_15.super_string_view._M_str = "MULTI_3";
  name_15.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                     (pcVar2,name_15,&result.Multi3);
  name_16.super_string_view._M_str = "MULTI_4";
  name_16.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                     (pcVar2,name_16,&result.Multi4);
  local_428._8_8_ = (pointer)0x0;
  local_410 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:285:13)>
              ::_M_invoke;
  local_418 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:285:13)>
              ::_M_manager;
  name_17.super_string_view._M_str = "FUNC_0";
  name_17.super_string_view._M_len = 6;
  local_428._0_8_ = &result;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_17,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_428,(ExpectAtLeast)0x1);
  local_448._8_8_ = 0;
  local_430 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:289:13)>
              ::_M_invoke;
  local_438 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:289:13)>
              ::_M_manager;
  name_18.super_string_view._M_str = "FUNC_1";
  name_18.super_string_view._M_len = 6;
  local_448._M_unused._M_object = &result;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_18,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_448,(ExpectAtLeast)0x1);
  local_468._8_8_ = 0;
  local_450 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:293:13)>
              ::_M_invoke;
  local_458 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:293:13)>
              ::_M_manager;
  name_19.super_string_view._M_str = "FUNC_2a";
  name_19.super_string_view._M_len = 7;
  local_468._0_8_ = &result;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_19,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_468,(ExpectAtLeast)0x1);
  local_488._8_8_ = 0;
  local_470 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:296:13)>
              ::_M_invoke;
  local_478 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:296:13)>
              ::_M_manager;
  name_20.super_string_view._M_str = "FUNC_2b";
  name_20.super_string_view._M_len = 7;
  local_488._0_8_ = &result;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_20,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_488,(ExpectAtLeast)0x1);
  local_4a8._8_8_ = 0;
  local_490 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:299:13)>
              ::_M_invoke;
  local_498 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:299:13)>
              ::_M_manager;
  name_21.super_string_view._M_str = "FUNC_3";
  name_21.super_string_view._M_len = 6;
  local_4a8._0_8_ = &result;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_21,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_4a8,(ExpectAtLeast)0x1);
  std::
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function(&local_4c8,
             (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_578);
  name_22.super_string_view._M_str = "FUNC_4a";
  name_22.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::Bind(pcVar2,name_22,&local_4c8,(ExpectAtLeast)0x1);
  std::
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function(&local_4e8,
             (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_578);
  name_23.super_string_view._M_str = "FUNC_4b";
  name_23.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::Bind(pcVar2,name_23,&local_4e8,(ExpectAtLeast)0x1);
  pcVar2 = cmArgumentParser<void>::BindParsedKeywords(pcVar2,&result.ParsedKeywords);
  pos = 0;
  cmArgumentParser<void>::
  Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
            (&local_408,pcVar2,
             (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             (anonymous_namespace)::args,&unparsedArguments,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&result,
              (_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_408);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_408);
  std::_Function_base::~_Function_base(&local_4e8.super__Function_base);
  std::_Function_base::~_Function_base(&local_4c8.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)local_4a8);
  std::_Function_base::~_Function_base((_Function_base *)local_488);
  std::_Function_base::~_Function_base((_Function_base *)local_468);
  std::_Function_base::~_Function_base((_Function_base *)&local_448);
  std::_Function_base::~_Function_base((_Function_base *)local_428);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&unparsedArguments_1);
  bVar1 = anon_unknown.dwarf_12986::verifyResult(&result,&unparsedArguments);
  std::_Function_base::~_Function_base((_Function_base *)&local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  anon_unknown.dwarf_12986::Result::~Result(&result);
  if (bVar1) {
    unparsedArguments_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unparsedArguments_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unparsedArguments_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown.dwarf_12986::Result::Result(&result);
    cmArgumentParser<(anonymous_namespace)::Result>::
    Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
              ((cmArgumentParser<(anonymous_namespace)::Result> *)&result,
               (Result *)&unparsedArguments_1,args,unparsedArguments_00,pos);
    bVar1 = anon_unknown.dwarf_12986::verifyResult(&result,&unparsedArguments_1);
    anon_unknown.dwarf_12986::Result::~Result(&result);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&unparsedArguments_1);
    if (bVar1) {
      unparsedArguments_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unparsedArguments_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unparsedArguments_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      anon_unknown.dwarf_12986::Result::Result(&result);
      bVar1 = cmArgumentParser<(anonymous_namespace)::Result>::
              Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
                        ((cmArgumentParser<(anonymous_namespace)::Result> *)&result,
                         (Result *)&unparsedArguments_1,args_00,unparsedArguments_00,pos);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(parserStatic.Parse(result, args, &unparsedArguments) == false) failed on line "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16a);
        std::operator<<(poVar3,"\n");
        anon_unknown.dwarf_12986::Result::~Result(&result);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&unparsedArguments_1);
      }
      else {
        bVar1 = anon_unknown.dwarf_12986::verifyResult(&result,&unparsedArguments_1);
        anon_unknown.dwarf_12986::Result::~Result(&result);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&unparsedArguments_1);
        if (bVar1) {
          return 0;
        }
      }
      pcVar4 = "While executing testArgumentParserStaticBool().\n";
    }
    else {
      pcVar4 = "While executing testArgumentParserStatic().\n";
    }
  }
  else {
    pcVar4 = "While executing testArgumentParserDynamic().\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
  return -1;
}

Assistant:

int testArgumentParser(int /*unused*/, char* /*unused*/[])
{
  if (!testArgumentParserDynamic()) {
    std::cout << "While executing testArgumentParserDynamic().\n";
    return -1;
  }

  if (!testArgumentParserStatic()) {
    std::cout << "While executing testArgumentParserStatic().\n";
    return -1;
  }

  if (!testArgumentParserStaticBool()) {
    std::cout << "While executing testArgumentParserStaticBool().\n";
    return -1;
  }

  return 0;
}